

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall Liby::http::HttpClient::handleReadEvent(HttpClient *this,Connection *conn)

{
  ReplyParser *this_00;
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  *this_01;
  int iVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  char *begin;
  char *pcVar4;
  off_t oVar5;
  Buffer *this_02;
  
  this_02 = &conn->readBuf_;
  bVar3 = Buffer::empty(this_02);
  if (!bVar3) {
    this_00 = &this->parser_;
    this_01 = &this->sendReqeustLists_;
    do {
      iVar1 = (this->parser_).bytes_;
      begin = Buffer::data(this_02);
      pcVar4 = Buffer::data(this_02);
      oVar5 = Buffer::size(this_02);
      ReplyParser::parse(this_00,begin,pcVar4 + oVar5);
      Buffer::retrieve(this_02,(long)(this->parser_).bytes_ - (long)iVar1);
      iVar1 = (this->parser_).progress_;
      if (6 < iVar1) {
        destroy(this);
        return;
      }
      if (iVar1 == 6) {
        p_Var2 = (this_01->
                 super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var2[0xc]._M_next != (_List_node_base *)0x0) {
          (*(code *)p_Var2[0xc]._M_prev)(p_Var2 + 0xb,this_00);
        }
        ReplyParser::clear(this_00);
        std::__cxx11::
        list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
        ::_M_erase(this_01,(this_01->
                           super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next);
      }
      bVar3 = Buffer::empty(this_02);
    } while (!bVar3);
  }
  return;
}

Assistant:

void HttpClient::handleReadEvent(Connection &conn) {
    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = parser_.bytes_;
        parser_.parse(readBuf.data(), readBuf.data() + readBuf.size());
        readBuf.retrieve(parser_.bytes_ - savedBytes);

        if (parser_.isError()) {
            handleErroEvent(conn);
            return;
        }

        if (parser_.isGood()) {
            auto &handler = sendReqeustLists_.front().second;
            if (handler) {
                handler(parser_);
            }
            parser_.clear();
            sendReqeustLists_.pop_front();
        }
    }
}